

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::_call<0>(cni_helper<cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           *this,vector *args,sequence<0> *param_2)

{
  undefined8 local_20;
  
  try_convert_and_check<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
  ::convert(*(var **)param_2);
  std::function<cs_impl::any_(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  operator()((function<cs_impl::any_(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
              *)&stack0xffffffffffffffe0,(list<cs_impl::any,_std::allocator<cs_impl::any>_> *)args);
  *(undefined8 *)&(this->mFunc).super__Function_base._M_functor = local_20;
  local_20 = (void *)0x0;
  any::recycle((any *)&stack0xffffffffffffffe0);
  return (any)(proxy *)this;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}